

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::ssl_stream<libtorrent::socks5_stream>::connected
          (ssl_stream<libtorrent::socks5_stream> *this,error_code *e,
          shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *h)

{
  bool bVar1;
  element_type *this_00;
  ssl_stream<libtorrent::socks5_stream> *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *local_20;
  shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *h_local;
  error_code *e_local;
  ssl_stream<libtorrent::socks5_stream> *this_local;
  
  local_20 = h;
  h_local = (shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *)e;
  e_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(e);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)h);
    std::function<void_(const_boost::system::error_code_&)>::operator()
              (this_00,(error_code *)h_local);
  }
  else {
    local_58 = handshake;
    local_50 = 0;
    local_60 = this;
    std::
    bind<void(libtorrent::ssl_stream<libtorrent::socks5_stream>::*)(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>),libtorrent::ssl_stream<libtorrent::socks5_stream>*,std::_Placeholder<1>const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>&>
              (&local_48,(offset_in_ssl_stream<libtorrent::socks5_stream>_to_subr *)&local_58,
               &local_60,(_Placeholder<1> *)&std::placeholders::_1,h);
    boost::asio::ssl::stream<libtorrent::socks5_stream>::
    async_handshake<std::_Bind<void(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
              (&this->m_sock,client,&local_48);
    std::
    _Bind<void_(libtorrent::ssl_stream<libtorrent::socks5_stream>::*(libtorrent::ssl_stream<libtorrent::socks5_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
    ::~_Bind(&local_48);
  }
  return;
}

Assistant:

void connected(error_code const& e, std::shared_ptr<handler_type> h)
	{
		if (e)
		{
			(*h)(e);
			return;
		}

		using std::placeholders::_1;
		m_sock.async_handshake(ssl::stream_base::client
			, std::bind(&ssl_stream::handshake, this, _1, h));
	}